

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.hpp
# Opt level: O0

void __thiscall
ccel::handler_pool<test_handler_class>::handler_pool
          (handler_pool<test_handler_class> *this,size_t pool_size,size_t handler_limit)

{
  io_context *in_RSI;
  size_type in_RDI;
  object_pool<test_handler_class,_boost::default_user_allocator_new_delete>
  *in_stack_ffffffffffffffd0;
  thread_group *in_stack_ffffffffffffffe0;
  
  boost::object_pool<test_handler_class,_boost::default_user_allocator_new_delete>::object_pool
            (in_stack_ffffffffffffffd0,in_RDI,0x24740a);
  boost::enable_shared_from_this<ccel::handler_pool<test_handler_class>_>::enable_shared_from_this
            ((enable_shared_from_this<ccel::handler_pool<test_handler_class>_> *)0x247417);
  boost::asio::io_context::io_context(in_RSI);
  boost::thread_group::thread_group(in_stack_ffffffffffffffe0);
  *(undefined8 *)(in_RDI + 0x1b8) = 0;
  *(undefined8 *)(in_RDI + 0x1c0) = 0;
  return;
}

Assistant:

handler_pool(std::size_t pool_size = 0, std::size_t handler_limit = 0)
      : _pool_size(0), _handler_limit(0){}